

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<long_long,QSocks5BindData*>::emplace<QSocks5BindData*const&>
          (QHash<long_long,QSocks5BindData*> *this,longlong *key,QSocks5BindData **args)

{
  QSocks5BindData *pQVar1;
  long in_FS_OFFSET;
  piter pVar2;
  QHash<long_long,_QSocks5BindData_*> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QSocks5BindData **)this;
  if (pQVar1 == (QSocks5BindData *)0x0) {
    local_28.d = (Data *)0x0;
  }
  else {
    if (*(uint *)&(pQVar1->super_QSocks5Data).controlSocket < 2) {
      if ((pQVar1->super_QSocks5Data).authenticator <
          (QSocks5Authenticator *)((ulong)(pQVar1->localAddress).d.d.ptr >> 1)) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          pVar2 = (piter)emplace_helper<QSocks5BindData*const&>(this,key,args);
          return (iterator)pVar2;
        }
      }
      else {
        local_28.d = (Data *)*args;
        pVar2 = (piter)emplace_helper<QSocks5BindData*>(this,key,(QSocks5BindData **)&local_28);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          return (iterator)pVar2;
        }
      }
      goto LAB_00222c32;
    }
    local_28.d = (Data *)pQVar1;
    if (*(int *)&(pQVar1->super_QSocks5Data).controlSocket != -1) {
      LOCK();
      *(int *)&(pQVar1->super_QSocks5Data).controlSocket =
           *(int *)&(pQVar1->super_QSocks5Data).controlSocket + 1;
      UNLOCK();
    }
  }
  QHash<long_long,_QSocks5BindData_*>::detach((QHash<long_long,_QSocks5BindData_*> *)this);
  pVar2 = (piter)emplace_helper<QSocks5BindData*const&>(this,key,args);
  QHash<long_long,_QSocks5BindData_*>::~QHash(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar2;
  }
LAB_00222c32:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }